

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68020_cptrapcc_32(void)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint in_EDI;
  uint uVar4;
  
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar2 = dasm_read_imm_16(in_EDI);
    uVar3 = dasm_read_imm_16(in_EDI);
    uVar4 = g_cpu_ir >> 9;
    pcVar1 = g_cpcc[uVar2 & 0x3f];
    get_imm_str_u(2);
    sprintf(g_dasm_str,"%dtrap%-4s %s; (extension = $%x) (2-3)",(ulong)(uVar4 & 7),pcVar1,
            get_imm_str_u::str,(ulong)uVar3);
    return;
  }
  if ((~g_cpu_ir & 0xf000) != 0) {
    d68000_illegal();
    return;
  }
  sprintf(g_dasm_str,"dc.w    $%04x; opcode 1111",(ulong)g_cpu_ir);
  return;
}

Assistant:

static void d68020_cptrapcc_32(void)
{
	uint extension1;
	uint extension2;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension1 = read_imm_16();
	extension2 = read_imm_16();
	sprintf(g_dasm_str, "%dtrap%-4s %s; (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[extension1&0x3f], get_imm_str_u32(), extension2);
}